

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O2

bool medit_speech(CHAR_DATA *ch,char *argument)

{
  uint uVar1;
  uint uVar2;
  MOB_INDEX_DATA *mob;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  SPEECH_DATA *pSVar7;
  SPEECH_DATA *pSVar8;
  SPEECH_DATA *pSVar9;
  LINE_DATA *pLVar10;
  LINE_DATA *pLVar11;
  LINE_DATA **ppLVar12;
  SPEECH_DATA **ppSVar13;
  char buf [4608];
  char name [4608];
  char cmd [4608];
  char arg3 [4608];
  char arg5 [4608];
  
  if (*argument == '\0') {
    send_to_char("The following speech commands are available:\n\r",ch);
    send_to_char("   speech list\n\r",ch);
    send_to_char("   speech add <speech_name>\n\r",ch);
    send_to_char("   speech del <speech_name>\n\r",ch);
    send_to_char("   speech <speech_name> line add <#delay> <type> <text>\n\r",ch);
    send_to_char("   speech <speech_name> line list\n\r",ch);
    send_to_char("   speech <speech_name> line <#> text <text>\n\r",ch);
    send_to_char("   speech <speech_name> line <#> delay <#>\n\r",ch);
    send_to_char("   speech <speech_name> line <#> type <type>\n\r",ch);
    pcVar6 = "   speech <speech_name> line <#> delete\n\r";
LAB_0039d27e:
    send_to_char(pcVar6,ch);
LAB_0039d3ec:
    bVar3 = true;
  }
  else {
    mob = (MOB_INDEX_DATA *)ch->desc->pEdit;
    pcVar6 = one_argument(argument,cmd);
    pcVar6 = one_argument(pcVar6,name);
    pcVar6 = one_argument(pcVar6,arg3);
    pSVar7 = find_speech(mob,cmd);
    if (pSVar7 == (SPEECH_DATA *)0x0) {
      bVar3 = str_prefix(cmd,"list");
      if (bVar3) {
        bVar3 = str_prefix(cmd,"add");
        if (bVar3) {
          bVar3 = str_prefix(cmd,"del");
          if (bVar3) {
            bVar3 = str_prefix(cmd,"edit");
            if (!bVar3) {
              return true;
            }
            pcVar6 = "Invalid speech command.\n\r";
          }
          else if (name[0] == '\0') {
            pcVar6 = "Delete which speech?\n\r";
          }
          else {
            pSVar7 = find_speech(mob,name);
            if (pSVar7 != (SPEECH_DATA *)0x0) {
              free_speech(pSVar7);
              pcVar6 = "Speech deleted.\n\r";
              goto LAB_0039d27e;
            }
            pcVar6 = "No speech by that name found.\n\r";
          }
        }
        else {
          if (name[0] != '\0') {
            pSVar8 = new_speech_data();
            pcVar6 = palloc_string(name);
            pSVar8->name = pcVar6;
            pSVar7 = mob->speech;
            if (mob->speech == (SPEECH_DATA *)0x0) {
              mob->speech = pSVar8;
            }
            else {
              do {
                pSVar9 = pSVar7;
                pSVar7 = pSVar9->next;
              } while (pSVar9->next != (SPEECH_DATA *)0x0);
              pSVar9->next = pSVar8;
              pSVar8->prev = pSVar9;
            }
            pcVar6 = "Speech added.\n\r";
            goto LAB_0039d27e;
          }
          pcVar6 = "You must specify a name for the new speech.\n\r";
        }
      }
      else {
        if (mob->speech != (SPEECH_DATA *)0x0) {
          send_to_char("Mobile has the following speeches defined:\n\r",ch);
          ppSVar13 = &mob->speech;
          while (pSVar8 = *ppSVar13, pSVar8 != (SPEECH_DATA *)0x0) {
            sprintf(buf,"%s\n\r",pSVar8->name);
            send_to_char(buf,ch);
            ppSVar13 = &pSVar8->next;
          }
LAB_0039d3df:
          if (pSVar7 != (SPEECH_DATA *)0x0) goto LAB_0039d3e4;
          goto LAB_0039d3ec;
        }
        pcVar6 = "Mobile has no speeches defined.\n\r";
      }
    }
    else {
      sort_speech(pSVar7);
      bVar3 = str_prefix(name,"line");
      if (bVar3) {
LAB_0039d3e4:
        sort_speech(pSVar7);
        goto LAB_0039d3ec;
      }
      bVar3 = str_prefix(arg3,"list");
      if (bVar3) {
        bVar3 = str_prefix(arg3,"add");
        pcVar6 = one_argument(pcVar6,buf);
        if (bVar3) {
          ppLVar12 = &pSVar7->first_line;
          while (pLVar10 = *ppLVar12, pLVar10 != (LINE_DATA *)0x0) {
            iVar5 = pLVar10->number;
            iVar4 = atoi(arg3);
            if (iVar5 == iVar4) {
              bVar3 = str_cmp(buf,"delete");
              if (!bVar3) {
                operator_delete(pLVar10,0x30);
                pcVar6 = "Deleted.\n\r";
                goto LAB_0039d27e;
              }
              bVar3 = str_prefix(buf,"delay");
              if (!bVar3) {
                iVar5 = atoi(pcVar6);
                pLVar10->delay = iVar5;
                pcVar6 = "Delay set.\n\r";
                goto LAB_0039d27e;
              }
              bVar3 = str_prefix(buf,"number");
              if (!bVar3) {
                iVar5 = atoi(pcVar6);
                pLVar10->number = iVar5;
                pcVar6 = "Number set.\n\r";
                goto LAB_0039d27e;
              }
              bVar3 = str_prefix(buf,"type");
              if (bVar3) {
                bVar3 = str_prefix(buf,"text");
                if (!bVar3) {
                  free_pstring(pLVar10->text);
                  pcVar6 = palloc_string(pcVar6);
                  pLVar10->text = pcVar6;
                  pcVar6 = "Text set.\n\r";
                  goto LAB_0039d27e;
                }
                pcVar6 = "Not a valid entry.\n\r";
                goto LAB_0039d5df;
              }
              iVar5 = flag_lookup(pcVar6,speech_table);
              if (iVar5 == -99) goto LAB_0039d48b;
              pLVar10->type = (short)iVar5;
              pcVar6 = "Type set.\n\r";
              goto LAB_0039d27e;
            }
            ppLVar12 = &pLVar10->next;
          }
          pcVar6 = "Not a valid line number.\n\r";
        }
        else {
          pcVar6 = one_argument(pcVar6,arg5);
          pLVar10 = new_line_data();
          iVar5 = atoi(buf);
          pLVar10->delay = iVar5;
          iVar5 = flag_lookup(arg5,speech_table);
          if (iVar5 != -99) {
            pLVar10->type = (short)iVar5;
            pcVar6 = palloc_string(pcVar6);
            pLVar10->text = pcVar6;
            pLVar11 = pSVar7->first_line;
            while (pLVar11->next != (LINE_DATA *)0x0) {
              pLVar11->next = pLVar10;
              pLVar11 = pLVar10;
            }
            pcVar6 = "Added.\n\r";
            goto LAB_0039d27e;
          }
LAB_0039d48b:
          pcVar6 = "Not a valid type.\n\r";
        }
      }
      else {
        if (pSVar7->first_line != (LINE_DATA *)0x0) {
          sprintf(buf,"%s Lines:\n\r",pSVar7->name);
          send_to_char(buf,ch);
          ppLVar12 = &pSVar7->first_line;
          while (pLVar10 = *ppLVar12, pLVar10 != (LINE_DATA *)0x0) {
            uVar1 = pLVar10->number;
            uVar2 = pLVar10->delay;
            pcVar6 = flag_name_lookup((long)pLVar10->type,speech_table);
            sprintf(buf,"Line #%d: %d %s %s\n\r",(ulong)uVar1,(ulong)uVar2,pcVar6,pLVar10->text);
            send_to_char(buf,ch);
            ppLVar12 = &pLVar10->next;
          }
          goto LAB_0039d3df;
        }
        pcVar6 = "This speech has no lines.\n\r";
      }
    }
LAB_0039d5df:
    send_to_char(pcVar6,ch);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool medit_speech(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMobIndex;
	SPEECH_DATA *speech, *sptr;
	char buf[MSL], cmd[MSL], name[MSL], arg3[MSL], arg4[MSL], arg5[MSL];
	LINE_DATA *lptr, *new_line;
	int type;

	EDIT_MOB(ch, pMobIndex);

	if (!*argument)
	{
		send_to_char("The following speech commands are available:\n\r", ch);
		send_to_char("   speech list\n\r", ch);
		send_to_char("   speech add <speech_name>\n\r", ch);
		send_to_char("   speech del <speech_name>\n\r", ch);
		send_to_char("   speech <speech_name> line add <#delay> <type> <text>\n\r", ch);
		send_to_char("   speech <speech_name> line list\n\r", ch);
		send_to_char("   speech <speech_name> line <#> text <text>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> delay <#>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> type <type>\n\r", ch);
		send_to_char("   speech <speech_name> line <#> delete\n\r", ch);
		/* list commands */
	}
	else
	{
		argument = one_argument(argument, cmd);
		argument = one_argument(argument, name);
		argument = one_argument(argument, arg3);

		speech = find_speech(pMobIndex, cmd);

		if (speech != nullptr)
		{
			sort_speech(speech);

			if (!str_prefix(name, "line"))
			{
				if (!str_prefix(arg3, "list"))
				{
					if (!speech->first_line)
					{
						send_to_char("This speech has no lines.\n\r", ch);
						return false;
					}

					sprintf(buf, "%s Lines:\n\r", speech->name);
					send_to_char(buf, ch);

					for (lptr = speech->first_line; lptr; lptr = lptr->next)
					{
						sprintf(buf, "Line #%d: %d %s %s\n\r",
							lptr->number,
							lptr->delay,
							flag_name_lookup(lptr->type, speech_table),
							lptr->text);
						send_to_char(buf, ch);
					}
				}
				else if (!str_prefix(arg3, "add"))
				{
					argument = one_argument(argument, arg4);
					argument = one_argument(argument, arg5);
					new_line = new_line_data();

					new_line->delay = atoi(arg4);
					type = flag_lookup(arg5, speech_table);

					if (type == NO_FLAG)
					{
						send_to_char("Not a valid type.\n\r", ch);
						return false;
					}

					new_line->type = type;
					new_line->text = palloc_string(argument);

					for (lptr = speech->first_line; lptr->next != nullptr; lptr = lptr->next)
					{
						lptr->next = new_line;
					}

					send_to_char("Added.\n\r", ch);
					return true;
				}
				else
				{
					argument = one_argument(argument, arg4);

					for (lptr = speech->first_line; lptr; lptr = lptr->next)
					{
						if (lptr->number == atoi(arg3))
							break;
					}

					if (!lptr)
					{
						send_to_char("Not a valid line number.\n\r", ch);
						return false;
					}
					else
					{
						if (!str_cmp(arg4, "delete"))
						{
							delete lptr;
							send_to_char("Deleted.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "delay"))
						{
							lptr->delay = atoi(argument);
							send_to_char("Delay set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "number"))
						{
							lptr->number = atoi(argument);
							send_to_char("Number set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "type"))
						{
							type = flag_lookup(argument, speech_table);

							if (type == NO_FLAG)
							{
								send_to_char("Not a valid type.\n\r", ch);
								return false;
							}

							lptr->type = type;
							send_to_char("Type set.\n\r", ch);
							return true;
						}
						else if (!str_prefix(arg4, "text"))
						{
							free_pstring(lptr->text);
							lptr->text = palloc_string(argument);

							send_to_char("Text set.\n\r", ch);
							return true;
						}
						else
						{
							send_to_char("Not a valid entry.\n\r", ch);
							return false;
						}
					}
				}
			}
		}
		else if (!str_prefix(cmd, "list"))
		{
			if (!pMobIndex->speech)
			{
				send_to_char("Mobile has no speeches defined.\n\r", ch);
				return false;
			}

			send_to_char("Mobile has the following speeches defined:\n\r", ch);

			for (sptr = pMobIndex->speech; sptr; sptr = sptr->next)
			{
				sprintf(buf, "%s\n\r", sptr->name);
				send_to_char(buf, ch);
			}
		}
		else if (!str_prefix(cmd, "add"))
		{
			if (!*name)
			{
				send_to_char("You must specify a name for the new speech.\n\r", ch);
				return false;
			}

			speech = new_speech_data();
			speech->name = palloc_string(name);

			if (!pMobIndex->speech)
			{
				pMobIndex->speech = speech;
			}
			else
			{
				for (sptr = pMobIndex->speech; sptr->next; sptr = sptr->next);
				sptr->next = speech;
				speech->prev = sptr;
			}

			send_to_char("Speech added.\n\r", ch);
			return true;
		}
		else if (!str_prefix(cmd, "del"))
		{
			if (!*name)
			{
				send_to_char("Delete which speech?\n\r", ch);
				return false;
			}

			speech = find_speech(pMobIndex, name);

			if (!speech)
			{
				send_to_char("No speech by that name found.\n\r", ch);
				return false;
			}

			free_speech(speech);
			send_to_char("Speech deleted.\n\r", ch);
			return true;
		}
		else if (!str_prefix(cmd, "edit"))
		{
			/* blah */
		}
		else
		{
			send_to_char("Invalid speech command.\n\r", ch);
			return false;
		}

		if (speech)
			sort_speech(speech);
	}

	return true;
}